

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_bin
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  undefined1 uVar1;
  uint uVar2;
  undefined1 n [16];
  format_specs specs;
  int iVar3;
  long in_RDI;
  undefined8 unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  bin_writer<1> in_stack_00000020;
  int num_digits;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar2) = 0x30;
    uVar1 = *(undefined1 *)(*(long *)(in_RDI + 8) + 8);
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar2) = uVar1;
  }
  n._8_8_ = in_stack_ffffffffffffff60;
  n._0_8_ = in_stack_ffffffffffffff58;
  iVar3 = count_digits<1u,unsigned__int128>(*(internal **)(in_RDI + 0x10),(unsigned___int128)n);
  get_prefix((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *)0x23785f);
  specs._8_8_ = unaff_retaddr;
  specs.width = (int)in_RDI;
  specs.precision = (int)((ulong)in_RDI >> 0x20);
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::bin_writer<1>>
            ((basic_writer<fmt::v6::buffer_range<char>_> *)CONCAT44(iVar3,in_stack_fffffffffffffff0)
             ,in_stack_ffffffffffffffec,(string_view)in_stack_00000008,specs,in_stack_00000020);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }